

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> * __thiscall
llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
          (basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *this)

{
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *this_local;
  
  if (this->Base == (MappingNode *)0x0) {
    __assert_fail("Base && \"Attempted to advance iterator past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                  ,0x16e,
                  "basic_collection_iterator<BaseT, ValueT> &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator++() [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
                 );
  }
  MappingNode::increment(this->Base);
  if (this->Base->CurrentEntry == (KeyValueNode *)0x0) {
    this->Base = (MappingNode *)0x0;
  }
  return this;
}

Assistant:

basic_collection_iterator &operator++() {
    assert(Base && "Attempted to advance iterator past end!");
    Base->increment();
    // Create an end iterator.
    if (!Base->CurrentEntry)
      Base = nullptr;
    return *this;
  }